

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse.c
# Opt level: O3

int bb_dominates(entrypoint *ep,basic_block *bb1,basic_block *bb2,unsigned_long generation)

{
  int iVar1;
  basic_block *bb2_00;
  int iVar2;
  undefined1 local_48 [8];
  ptr_list_iter parentiter__;
  
  if (ep->entry->bb == bb2) {
LAB_0012c109:
    iVar2 = 0;
  }
  else {
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)bb2->parents);
    bb2_00 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_48);
    iVar2 = 1;
    if (bb2_00 != (basic_block *)0x0) {
      do {
        if ((bb2_00 != bb1) && (bb2_00->generation != generation)) {
          bb2_00->generation = generation;
          iVar1 = bb_dominates(ep,bb1,bb2_00,generation);
          if (iVar1 == 0) goto LAB_0012c109;
        }
        bb2_00 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (bb2_00 != (basic_block *)0x0);
    }
  }
  return iVar2;
}

Assistant:

static int bb_dominates(struct entrypoint *ep, struct basic_block *bb1, struct basic_block *bb2, unsigned long generation)
{
	struct basic_block *parent;

	/* Nothing dominates the entrypoint.. */
	if (bb2 == ep->entry->bb)
		return 0;
	FOR_EACH_PTR(bb2->parents, parent) {
		if (parent == bb1)
			continue;
		if (parent->generation == generation)
			continue;
		parent->generation = generation;
		if (!bb_dominates(ep, bb1, parent, generation))
			return 0;
	} END_FOR_EACH_PTR(parent);
	return 1;
}